

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O2

void __thiscall RasterizerA3<4U>::reset(RasterizerA3<4U> *this)

{
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    free(this->_bits);
    free(this->_cells);
    (this->super_CellRasterizer).super_Rasterizer._width = 0;
    (this->super_CellRasterizer).super_Rasterizer._height = 0;
    (this->_yBounds).start = 0x7fffffff;
    *(undefined8 *)&(this->_yBounds).end = 0;
    *(undefined8 *)((long)&this->_bitStride + 4) = 0;
    *(undefined8 *)((long)&this->_bits + 4) = 0;
    *(undefined8 *)((long)&this->_cellStride + 4) = 0;
    *(undefined4 *)((long)&this->_cells + 4) = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }